

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidLayerNormalizationNoNormalizedShape(void)

{
  RepeatedField<long> *pRVar1;
  pointer pcVar2;
  ConvolutionLayerParams *pCVar3;
  Rep *pRVar4;
  bool bVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  TypeUnion this;
  Type *this_00;
  LayerNormalizationLayerParams *this_01;
  WeightParams *pWVar10;
  ostream *poVar11;
  string *psVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  Result res;
  Model m;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Model local_48;
  
  CoreML::Specification::Model::Model(&local_48);
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_48.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_70 + 0x10;
  local_70._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar2) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pRVar1 = &pAVar9->shape_;
  iVar15 = (pAVar9->shape_).total_size_;
  if ((pAVar9->shape_).current_size_ == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
  }
  iVar15 = (pAVar9->shape_).current_size_;
  iVar14 = iVar15 + 1;
  (pAVar9->shape_).current_size_ = iVar14;
  ((pAVar9->shape_).rep_)->elements[iVar15] = 3;
  iVar15 = (pAVar9->shape_).total_size_;
  if (iVar14 == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
  }
  iVar15 = (pAVar9->shape_).current_size_;
  iVar14 = iVar15 + 1;
  (pAVar9->shape_).current_size_ = iVar14;
  ((pAVar9->shape_).rep_)->elements[iVar15] = 5;
  iVar15 = (pAVar9->shape_).total_size_;
  if (iVar14 == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
  }
  iVar15 = (pAVar9->shape_).current_size_;
  (pAVar9->shape_).current_size_ = iVar15 + 1;
  ((pAVar9->shape_).rep_)->elements[iVar15] = 2;
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_48.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_70._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar2) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pRVar1 = &pAVar9->shape_;
  iVar15 = (pAVar9->shape_).total_size_;
  if ((pAVar9->shape_).current_size_ == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
  }
  iVar15 = (pAVar9->shape_).current_size_;
  iVar14 = iVar15 + 1;
  (pAVar9->shape_).current_size_ = iVar14;
  ((pAVar9->shape_).rep_)->elements[iVar15] = 3;
  iVar15 = (pAVar9->shape_).total_size_;
  if (iVar14 == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
  }
  iVar15 = (pAVar9->shape_).current_size_;
  iVar14 = iVar15 + 1;
  (pAVar9->shape_).current_size_ = iVar14;
  ((pAVar9->shape_).rep_)->elements[iVar15] = 5;
  iVar15 = (pAVar9->shape_).total_size_;
  if (iVar14 == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
  }
  iVar15 = (pAVar9->shape_).current_size_;
  (pAVar9->shape_).current_size_ = iVar15 + 1;
  ((pAVar9->shape_).rep_)->elements[iVar15] = 2;
  if (local_48._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_48);
    local_48._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_48.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  (local_48.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_48.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  if (this_00->_oneof_case_[0] != 0x546) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x546;
    this_01 = (LayerNormalizationLayerParams *)operator_new(0x40);
    CoreML::Specification::LayerNormalizationLayerParams::LayerNormalizationLayerParams(this_01);
    (this_00->layer_).layernormalization_ = this_01;
  }
  pCVar3 = (this_00->layer_).convolution_;
  lVar13._0_4_ = (pCVar3->stride_).current_size_;
  lVar13._4_4_ = (pCVar3->stride_).total_size_;
  if (lVar13 == 0) {
    pWVar10 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar10);
    *(WeightParams **)&pCVar3->stride_ = pWVar10;
  }
  lVar13 = *(long *)&pCVar3->stride_;
  if (*(int *)(lVar13 + 0x10) == *(int *)(lVar13 + 0x14)) {
    google::protobuf::RepeatedField<float>::Reserve
              ((RepeatedField<float> *)(lVar13 + 0x10),*(int *)(lVar13 + 0x14) + 1);
  }
  iVar15 = *(int *)(lVar13 + 0x10);
  *(int *)(lVar13 + 0x10) = iVar15 + 1;
  *(undefined4 *)(*(long *)(lVar13 + 0x18) + 8 + (long)iVar15 * 4) = 0x3f800000;
  if ((pCVar3->stride_).rep_ == (Rep *)0x0) {
    pWVar10 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar10);
    (pCVar3->stride_).rep_ = (Rep *)pWVar10;
  }
  pRVar4 = (pCVar3->stride_).rep_;
  iVar15 = *(int *)((long)&pRVar4[1].arena + 4);
  if (*(int *)&pRVar4[1].arena == iVar15) {
    google::protobuf::RepeatedField<float>::Reserve((RepeatedField<float> *)(pRVar4 + 1),iVar15 + 1)
    ;
  }
  iVar15 = *(int *)&pRVar4[1].arena;
  *(int *)&pRVar4[1].arena = iVar15 + 1;
  *(undefined4 *)(pRVar4[1].elements[0] + 8 + (long)iVar15 * 4) = 0;
  CoreML::validate<(MLModelType)500>((Result *)local_70,&local_48);
  bVar5 = CoreML::Result::good((Result *)local_70);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16bc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  }
  else {
    psVar12 = CoreML::Result::message_abi_cxx11_((Result *)local_70);
    iVar15 = 0;
    lVar13 = std::__cxx11::string::find((char *)psVar12,0x339be0,0);
    if (lVar13 != -1) goto LAB_001a14f7;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16bd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"res.message().find(\"Normalized shape\") != std::string::npos",0x3b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  }
  std::ostream::put((char)poVar11);
  iVar15 = 1;
  std::ostream::flush();
LAB_001a14f7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._8_8_ != &local_58) {
    operator_delete((void *)local_70._8_8_,local_58._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_48);
  return iVar15;
}

Assistant:

int testInvalidLayerNormalizationNoNormalizedShape() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    auto* params = layers->mutable_layernormalization();
    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(0.0);

    // not specifying the value for normalized shape
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("Normalized shape") != std::string::npos);

    return 0;

}